

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

long Js::InterpreterStackFrame::AsmJsInterpreter<long>(AsmJsCallStackLayout *layout)

{
  uint16 uVar1;
  ScriptFunction *function;
  FunctionBody *pFVar2;
  AsmJsFunctionInfo *pAVar3;
  void *unaff_retaddr;
  undefined1 auStack_88 [8];
  AsmJsReturnStruct asmJsReturn;
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo;
  
  function = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(layout->functionObject);
  pFVar2 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  pAVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     ((FunctionProxy *)pFVar2);
  uVar1 = UInt16Math::Add(pAVar3->mArgCount,1);
  local_38 = (CallInfo)((ulong)uVar1 | 0x2000000);
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)((long)&asmJsReturn.simd.field_0 + 8),&local_38,
             &layout[1].functionObject);
  pFVar2 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  FunctionBody::EnsureDynamicProfileInfo(pFVar2);
  asmJsReturn.d = 0.0;
  asmJsReturn.simd.field_0.f64[0] = 0.0;
  asmJsReturn.l = 0;
  asmJsReturn.f = 0.0;
  asmJsReturn._20_4_ = 0;
  auStack_88 = (undefined1  [8])0x0;
  asmJsReturn.i = 0;
  asmJsReturn._4_4_ = 0;
  args.super_Arguments.Values = (Type)asmJsReturn.simd.field_0.f64[1];
  InterpreterHelper(function,(ArgumentReader *)&args.super_Arguments.Values,unaff_retaddr,
                    &stack0x00000000,(AsmJsReturnStruct *)auStack_88);
  return asmJsReturn._0_8_;
}

Assistant:

T InterpreterStackFrame::AsmJsInterpreter(AsmJsCallStackLayout* layout)
    {
        Js::ScriptFunction * function = Js::VarTo<Js::ScriptFunction>(layout->functionObject);
        int  flags = CallFlags_Value;
        ArgSlot nbArgs = ArgSlotMath::Add(function->GetFunctionBody()->GetAsmJsFunctionInfo()->GetArgCount(), 1);

        CallInfo callInfo((CallFlags)flags, nbArgs);
        ArgumentReader args(&callInfo, (Var*)layout->args);
        void* returnAddress = _ReturnAddress();
        void* addressOfReturnAddress = _AddressOfReturnAddress();
        function->GetFunctionBody()->EnsureDynamicProfileInfo();
        AsmJsReturnStruct asmJsReturn = { 0 };
        InterpreterHelper(function, args, returnAddress, addressOfReturnAddress, &asmJsReturn);

        return asmJsReturn.GetRetVal<T>();
    }